

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::LightSource
          (ParsedScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  char (*in_RDX) [12];
  FileLoc *in_RDI;
  AnimatedTransform renderFromLight;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_fffffffffffff708;
  value_type *__x;
  ParameterDictionary *in_stack_fffffffffffff710;
  LightSceneEntity *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffff718;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffff720;
  char *fmt;
  RGBColorSpace *in_stack_fffffffffffff758;
  ParsedParameterVector *in_stack_fffffffffffff760;
  ParsedParameterVector *in_stack_fffffffffffff768;
  ParameterDictionary *in_stack_fffffffffffff770;
  int in_stack_fffffffffffff79c;
  ParsedScene *in_stack_fffffffffffff7a0;
  string *in_stack_fffffffffffff7d0;
  AnimatedTransform *in_stack_fffffffffffff7d8;
  ParameterDictionary *in_stack_fffffffffffff7e0;
  string *in_stack_fffffffffffff7e8;
  LightSceneEntity *in_stack_fffffffffffff7f0;
  FileLoc in_stack_fffffffffffff800;
  Float in_stack_fffffffffffffc74;
  Transform *in_stack_fffffffffffffc78;
  Float in_stack_fffffffffffffc84;
  Transform *in_stack_fffffffffffffc88;
  AnimatedTransform *in_stack_fffffffffffffc90;
  
  fmt = &stack0x00000008;
  if (*(int *)&in_RDI[0x59].filename._M_str == 2) {
    Error<char_const(&)[12]>(in_RDI,fmt,in_RDX);
  }
  else if (*(int *)&in_RDI[0x59].filename._M_str == 0) {
    Error<char_const(&)[12]>(in_RDI,fmt,in_RDX);
  }
  else {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    ParameterDictionary::ParameterDictionary
              (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
               in_stack_fffffffffffff758);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&in_stack_fffffffffffff710->params);
    GetCTM(in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c);
    GetCTM(in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c);
    AnimatedTransform::AnimatedTransform
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
               in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
    ParameterDictionary::ParameterDictionary(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    __x = *(value_type **)fmt;
    this_00 = *(LightSceneEntity **)(fmt + 8);
    LightSceneEntity::LightSceneEntity
              (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
               in_stack_fffffffffffff800,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
    std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>::push_back
              ((vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *)this_00,
               __x);
    LightSceneEntity::~LightSceneEntity(this_00);
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9cbbe2);
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9cbbef);
  }
  return;
}

Assistant:

void ParsedScene::LightSource(const std::string &name, ParsedParameterVector params,
                              FileLoc loc) {
    VERIFY_WORLD("LightSource");
    ParameterDictionary dict(std::move(params), graphicsState->lightAttributes,
                             graphicsState->colorSpace);
    AnimatedTransform renderFromLight(GetCTM(0), transformStartTime, GetCTM(1),
                                      transformEndTime);

    lights.push_back(LightSceneEntity(name, std::move(dict), loc, renderFromLight,
                                      graphicsState->currentOutsideMedium));
}